

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

HelicsFederate helicsCreateCallbackFederateFromConfig(char *configFile,HelicsError *err)

{
  HelicsFederate pvVar1;
  allocator<char> local_69;
  shared_ptr<helics::Federate> fed;
  undefined1 local_58 [48];
  shared_ptr<helics::Federate> local_28;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (configFile == (char *)0x0) {
      std::__cxx11::string::string((string *)(local_58 + 0x10),&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_58 + 0x10),configFile,&local_69);
    }
    std::make_shared<helics::CallbackFederate,std::__cxx11::string_const>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::__shared_ptr<helics::Federate,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Federate,(__gnu_cxx::_Lock_policy)2> *)&fed,
               (__shared_ptr<helics::CallbackFederate,_(__gnu_cxx::_Lock_policy)2> *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    std::__cxx11::string::~string((string *)(local_58 + 0x10));
    local_28.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_28.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pvVar1 = generateNewHelicsFederateObject(&local_28,CALLBACK);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&fed.super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    pvVar1 = (HelicsFederate)0x0;
  }
  return pvVar1;
}

Assistant:

HelicsFederate helicsCreateCallbackFederateFromConfig(const char* configFile, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    std::shared_ptr<helics::Federate> fed;
    try {
        fed = std::make_shared<helics::CallbackFederate>(AS_STRING(configFile));
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }

    return generateNewHelicsFederateObject(std::move(fed), helics::FederateType::CALLBACK);
}